

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O3

void png_warning_parameter_signed(char (*p) [32],int number,int format,png_int_32 value)

{
  png_const_charp string;
  png_alloc_size_t number_00;
  char buffer [24];
  char acStack_38 [24];
  
  number_00 = (png_alloc_size_t)(uint)value;
  if (value < 1) {
    number_00 = (png_alloc_size_t)(uint)-value;
  }
  string = png_format_number(acStack_38,&stack0xffffffffffffffe0,format,number_00);
  if (acStack_38 < string && value < 0) {
    string[-1] = '-';
    string = string + -1;
  }
  png_warning_parameter(p,number,string);
  return;
}

Assistant:

void
png_warning_parameter_signed(png_warning_parameters p, int number, int format,
    png_int_32 value)
{
   png_alloc_size_t u;
   png_charp str;
   char buffer[PNG_NUMBER_BUFFER_SIZE];

   /* Avoid overflow by doing the negate in a png_alloc_size_t: */
   u = (png_alloc_size_t)value;
   if (value < 0)
      u = ~u + 1;

   str = PNG_FORMAT_NUMBER(buffer, format, u);

   if (value < 0 && str > buffer)
      *--str = '-';

   png_warning_parameter(p, number, str);
}